

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O1

int __thiscall Fossilize::ExternalReplayer::Impl::kill(Impl *this,__pid_t __pid,int __sig)

{
  int iVar1;
  ssize_t sVar2;
  int __sig_00;
  __pid_t __pgrp;
  char dummy;
  undefined1 local_11;
  
  if (this->pid < 0) {
    return 0;
  }
  if (-1 < this->kill_fd) {
    sVar2 = read(this->kill_fd,&local_11,1);
    close(this->kill_fd);
    this->kill_fd = -1;
    if (sVar2 < 0) {
      return 0;
    }
  }
  __pgrp = this->pid;
  __sig_00 = 9;
  iVar1 = killpg(__pgrp,9);
  if (iVar1 != 0) {
    kill(__pgrp,__sig_00);
    return 0;
  }
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool ExternalReplayer::Impl::kill()
{
	if (pid < 0)
		return false;

	if (kill_fd >= 0)
	{
		// Before we attempt to kill, we must make sure that the new process group has been created.
		// This read will block until we close the FD in the forked process, ensuring that we
		// can immediately call killpg() against it, since that close will only happen after setpgid().
		char dummy;
		if (::read(kill_fd, &dummy, sizeof(dummy)) < 0)
		{
			close(kill_fd);
			kill_fd = -1;
			return false;
		}
		close(kill_fd);
		kill_fd = -1;
	}

	bool ret = killpg(pid, SIGKILL) == 0;
	if (!ret)
		LOGI("ExternalReplayer::Impl::kill(): Failed to kill: errno %d.\n", errno);
	return ret;
}